

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::_ResetForNewFrame(ImDrawList *this)

{
  ImDrawCmd local_48;
  
  if (1 < (this->_Splitter)._Count) {
    ImDrawListSplitter::Merge(&this->_Splitter,this);
  }
  ImVector<ImDrawCmd>::resize(&this->CmdBuffer,0);
  ImVector<unsigned_short>::resize(&this->IdxBuffer,0);
  ImVector<ImDrawVert>::resize(&this->VtxBuffer,0);
  this->Flags = this->_Data->InitialFlags;
  (this->_CmdHeader).ClipRect.x = 0.0;
  (this->_CmdHeader).ClipRect.y = 0.0;
  (this->_CmdHeader).ClipRect.z = 0.0;
  (this->_CmdHeader).ClipRect.w = 0.0;
  (this->_CmdHeader).TextureId = (ImTextureID)0x0;
  *(undefined8 *)&(this->_CmdHeader).VtxOffset = 0;
  this->_VtxCurrentIdx = 0;
  this->_VtxWritePtr = (ImDrawVert *)0x0;
  this->_IdxWritePtr = (ImDrawIdx *)0x0;
  ImVector<ImVec4>::resize(&this->_ClipRectStack,0);
  ImVector<void_*>::resize(&this->_TextureIdStack,0);
  ImVector<ImVec2>::resize(&this->_Path,0);
  (this->_Splitter)._Current = 0;
  (this->_Splitter)._Count = 1;
  local_48.ElemCount = 0;
  local_48._36_4_ = 0;
  local_48.UserCallback = (ImDrawCallback)0x0;
  local_48.TextureId = (ImTextureID)0x0;
  local_48.VtxOffset = 0;
  local_48.IdxOffset = 0;
  local_48.ClipRect.x = 0.0;
  local_48.ClipRect.y = 0.0;
  local_48.ClipRect.z = 0.0;
  local_48.ClipRect.w = 0.0;
  local_48.UserCallbackData = (void *)0x0;
  ImVector<ImDrawCmd>::push_back(&this->CmdBuffer,&local_48);
  this->_FringeScale = 1.0;
  return;
}

Assistant:

void ImDrawList::_ResetForNewFrame()
{
    // Verify that the ImDrawCmd fields we want to memcmp() are contiguous in memory.
    IM_STATIC_ASSERT(IM_OFFSETOF(ImDrawCmd, ClipRect) == 0);
    IM_STATIC_ASSERT(IM_OFFSETOF(ImDrawCmd, TextureId) == sizeof(ImVec4));
    IM_STATIC_ASSERT(IM_OFFSETOF(ImDrawCmd, VtxOffset) == sizeof(ImVec4) + sizeof(ImTextureID));
    if (_Splitter._Count > 1)
        _Splitter.Merge(this);

    CmdBuffer.resize(0);
    IdxBuffer.resize(0);
    VtxBuffer.resize(0);
    Flags = _Data->InitialFlags;
    memset(&_CmdHeader, 0, sizeof(_CmdHeader));
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.resize(0);
    _TextureIdStack.resize(0);
    _Path.resize(0);
    _Splitter.Clear();
    CmdBuffer.push_back(ImDrawCmd());
    _FringeScale = 1.0f;
}